

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O2

void yprp_restr(lys_ypr_ctx_conflict *pctx,lysp_restr *restr,ly_stmt stmt,char *attr,int8_t *flag)

{
  uint16_t *puVar1;
  ly_out *out;
  ulong in_RAX;
  char *pcVar2;
  uint uVar3;
  ulong uStack_38;
  int8_t inner_flag;
  
  uStack_38 = in_RAX & 0xffffffffffffff;
  if (restr != (lysp_restr *)0x0) {
    out = (pctx->field_0).field_0.out;
    uVar3 = 0;
    if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
        (undefined1  [24])0x0) {
      uVar3 = (uint)(pctx->field_0).field_0.level * 2;
    }
    pcVar2 = lyplg_ext_stmt2str(stmt);
    ly_print_(out,"%*s<%s %s=\"",(ulong)uVar3,"",pcVar2,attr);
    pcVar2 = (restr->arg).str;
    if ((*pcVar2 == '\x15') || (*pcVar2 == '\x06')) {
      pcVar2 = pcVar2 + 1;
    }
    lyxml_dump_text((pctx->field_0).field_0.out,pcVar2,'\x01');
    ly_print_((pctx->field_0).field_0.out,"\"");
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 + 1;
    yprp_extension_instances(pctx,stmt,'\0',restr->exts,&inner_flag);
    if (*(restr->arg).str == '\x15') {
      ypr_close_parent(pctx,&inner_flag);
      ypr_substmt(pctx,LY_STMT_MODIFIER,'\0',"invert-match",restr->exts);
    }
    if (restr->emsg != (char *)0x0) {
      ypr_close_parent(pctx,&inner_flag);
      ypr_substmt(pctx,LY_STMT_ERROR_MESSAGE,'\0',restr->emsg,restr->exts);
    }
    if (restr->eapptag != (char *)0x0) {
      ypr_close_parent(pctx,&inner_flag);
      ypr_substmt(pctx,LY_STMT_ERROR_APP_TAG,'\0',restr->eapptag,restr->exts);
    }
    ypr_description(pctx,restr->dsc,restr->exts,&inner_flag);
    ypr_reference(pctx,restr->ref,restr->exts,&inner_flag);
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 - 1;
    pcVar2 = lyplg_ext_stmt2str(stmt);
    ypr_close(pctx,pcVar2,inner_flag);
  }
  return;
}

Assistant:

static void
yprp_restr(struct lys_ypr_ctx *pctx, const struct lysp_restr *restr, enum ly_stmt stmt, ly_bool *flag)
{
    ly_bool inner_flag = 0;
    const char *text;
    uint16_t flags = 0;

    if (!restr) {
        return;
    }

    ypr_open(pctx->out, flag);
    text = ((restr->arg.str[0] != LYSP_RESTR_PATTERN_NACK) && (restr->arg.str[0] != LYSP_RESTR_PATTERN_ACK)) ?
            restr->arg.str : restr->arg.str + 1;
    if (!strchr(text, '\n')) {
        flags |= LYS_YPR_TEXT_SINGLELINE;
    }
    if (restr->arg.flags & LYS_SINGLEQUOTED) {
        flags |= LYS_YPR_TEXT_SINGLEQUOTED;
    }
    ypr_text(pctx, lyplg_ext_stmt2str(stmt), text, flags);

    LEVEL++;
    yprp_extension_instances(pctx, stmt, 0, restr->exts, &inner_flag);
    if (restr->arg.str[0] == LYSP_RESTR_PATTERN_NACK) {
        /* special byte value in pattern's expression: 0x15 - invert-match, 0x06 - match */
        ypr_open(pctx->out, &inner_flag);
        ypr_substmt(pctx, LY_STMT_MODIFIER, 0, "invert-match", 0, restr->exts);
    }
    if (restr->emsg) {
        ypr_open(pctx->out, &inner_flag);
        ypr_substmt(pctx, LY_STMT_ERROR_MESSAGE, 0, restr->emsg, 0, restr->exts);
    }
    if (restr->eapptag) {
        ypr_open(pctx->out, &inner_flag);
        ypr_substmt(pctx, LY_STMT_ERROR_APP_TAG, 0, restr->eapptag, 0, restr->exts);
    }
    ypr_description(pctx, restr->dsc, restr->exts, &inner_flag);
    ypr_reference(pctx, restr->ref, restr->exts, &inner_flag);

    LEVEL--;
    ypr_close(pctx, inner_flag);
}